

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

Error __thiscall argstest::FlagBase::GetError(FlagBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong extraout_RDX;
  Error matcherError;
  Nargs nargs;
  FlagBase *this_local;
  
  iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[0x15])();
  if (extraout_RDX < CONCAT44(extraout_var,iVar1)) {
    this_local._4_4_ = Usage;
  }
  else {
    this_local._4_4_ = Matcher::GetError(&this->matcher);
    if (this_local._4_4_ == None) {
      this_local._4_4_ = (this->super_NamedBase).super_Base.error;
    }
  }
  return this_local._4_4_;
}

Assistant:

virtual Error GetError() const override
            {
                const auto nargs = NumberOfArguments();
                if (nargs.min > nargs.max)
                {
                    return Error::Usage;
                }

                const auto matcherError = matcher.GetError();
                if (matcherError != Error::None)
                {
                    return matcherError;
                }

                return error;
            }